

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Shape *pSVar2;
  string_view name;
  string_view name_00;
  t_type_info<Square> ret;
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  h;
  type_info local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  local_30.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super_type_info.destroy = (v_pv_f)0x0;
  local_a8.super_type_info.name._M_len = 2;
  local_a8.super_type_info.name._M_str = "sq";
  local_a8.super_type_info.size = 0x30;
  local_a8.super_type_info.alignment = 8;
  local_a8.super_type_info.default_construct_at = (v_pv_f)0x0;
  local_a8.super_type_info.alloc_and_construct = (pv_v_f)0x0;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Square>(&local_30,(t_type_info<Square> *)&local_a8);
  local_a8.super_type_info.destroy = (v_pv_f)0x0;
  local_a8.super_type_info.name._M_len = 2;
  local_a8.super_type_info.name._M_str = "ci";
  local_a8.super_type_info.size = 0x30;
  local_a8.super_type_info.alignment = 8;
  local_a8.super_type_info.default_construct_at = (v_pv_f)0x0;
  local_a8.super_type_info.alloc_and_construct = (pv_v_f)0x0;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Circle>(&local_30,(t_type_info<Circle> *)&local_a8);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"asd","");
  name._M_str = "sq";
  name._M_len = 2;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::find_type_info(&local_a8,&local_30,name);
  if (local_a8.super_type_info.name._M_len == 0) {
    pSVar2 = (Shape *)0x0;
  }
  else {
    pSVar2 = (*local_a8.alloc_and_construct_a)(&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*pSVar2->_vptr_Shape[1])(pSVar2,&std::cout);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cici","");
  name_00._M_str = "ci";
  name_00._M_len = 2;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::find_type_info(&local_a8,&local_30,name_00);
  if (local_a8.super_type_info.name._M_len == 0) {
    pSVar2 = (Shape *)0x0;
  }
  else {
    pSVar2 = (*local_a8.alloc_and_construct_a)(&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*pSVar2->_vptr_Shape[1])(pSVar2,&std::cout);
  if (local_30.m_registered_types.
      super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.m_registered_types.
                    super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.m_registered_types.
                          super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.m_registered_types.
                          super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    trex::hierarchy<Shape, std::string> h;
    h.register_type(trex::make_type_info<Square>("sq"));
    h.register_type(trex::make_type_info<Circle>("ci"));

    auto c = h.alloc_and_construct("sq", "asd");
    c->log(std::cout);

    c = h.alloc_and_construct("ci", "cici");
    c->log(std::cout);

    return 0;
}